

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::EmitLoadInstance
          (ByteCodeGenerator *this,Symbol *sym,IdentPtr pid,RegSlot *pThisLocation,
          RegSlot *pInstLocation,FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  PropertyId PVar4;
  uint uVar5;
  ByteCodeLabel labelID;
  RegSlot value;
  Scope **ppSVar6;
  undefined4 *puVar7;
  Scope *pSVar8;
  Type *pTVar9;
  DynamicLoadKind DVar10;
  int i;
  int index;
  undefined1 local_b0 [8];
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  recList;
  undefined1 local_68 [8];
  DynamicLoadRecord rec;
  PropertyId local_44;
  ByteCodeWriter *pBStack_40;
  PropertyId envIndex;
  RegSlot local_38;
  RegSlot local_34;
  
  local_38 = *pThisLocation;
  local_34 = *pInstLocation;
  local_44 = -1;
  ppSVar6 = &sym->scope;
  if (sym == (Symbol *)0x0) {
    ppSVar6 = &this->globalScope;
  }
  pSVar8 = *ppSVar6;
  recList._40_8_ = pid;
  if (pSVar8 == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1073,"(symScope)","symScope");
    if (!bVar2) goto LAB_00817fc2;
    *puVar7 = 0;
  }
  if ((sym != (Symbol *)0x0) && ((sym->field_0x43 & 0x40) != 0)) {
    *pInstLocation = 0xffffffff;
    return;
  }
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>._16_8_ =
       this->alloc;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
  _0_4_ = 0;
  local_b0 = (undefined1  [8])&PTR_IsReadOnly_014f2c30;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  unique0x1000094b = pSVar8;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  pBStack_40 = &this->m_writer;
  rec.label = -1;
  pSVar8 = (Scope *)0x0;
  while (pSVar8 = FindScopeForSym(this,stack0xffffffffffffffa8,pSVar8,&local_44,funcInfo),
        pSVar8 != this->globalScope) {
    if (local_34 == 0xffffffff && pSVar8 != stack0xffffffffffffffa8) {
      local_34 = FuncInfo::AcquireTmpRegister(funcInfo);
    }
    if (local_44 == -1) {
      if (pSVar8->func != funcInfo) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1094,"(funcInfo == scope->GetFunc())","funcInfo == scope->GetFunc()");
        if (!bVar2) goto LAB_00817fc2;
        *puVar7 = 0;
      }
      rec.label = pSVar8->location;
    }
    if (pSVar8 == stack0xffffffffffffffa8) break;
    if ((pSVar8 == (Scope *)0x0) || ((pSVar8->field_0x44 & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x109e,"(scope && scope->GetIsDynamic())","scope && scope->GetIsDynamic()"
                        );
      if (!bVar2) goto LAB_00817fc2;
      *puVar7 = 0;
    }
    if ((pSVar8->field_0x44 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x109f,"(scope->GetIsObject())","scope->GetIsObject()");
      if (!bVar2) goto LAB_00817fc2;
      *puVar7 = 0;
    }
    DynamicLoadRecord::DynamicLoadRecord((DynamicLoadRecord *)local_68);
    local_68._4_4_ = Js::ByteCodeWriter::DefineLabel(pBStack_40);
    if (sym == (Symbol *)0x0) {
      PVar4 = *(PropertyId *)(recList._40_8_ + 0x1c);
    }
    else {
      PVar4 = Symbol::EnsurePosition(sym,this);
    }
    uVar5 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,PVar4);
    if (pSVar8->scopeType == ScopeType_With) {
      if (local_38 == 0xffffffff) {
        local_38 = FuncInfo::AcquireTmpRegister(funcInfo);
      }
      if (local_44 == -1) {
        Js::ByteCodeWriter::BrProperty(pBStack_40,BrOnHasProperty,local_68._4_4_,rec.label,uVar5);
        local_68._0_4_ = LocalWith;
        rec.kind = rec.label;
      }
      else {
        DVar10 = local_44 + Local;
        Js::ByteCodeWriter::BrEnvProperty(pBStack_40,BrOnHasEnvProperty,local_68._4_4_,uVar5,DVar10)
        ;
        local_68._0_4_ = EnvWith;
        rec.kind = DVar10;
      }
    }
    else if (local_44 == -1) {
      Js::ByteCodeWriter::BrLocalProperty(pBStack_40,BrOnHasLocalProperty,local_68._4_4_,uVar5);
      local_68._0_4_ = Local;
    }
    else {
      DVar10 = local_44 + Local;
      Js::ByteCodeWriter::BrEnvProperty
                (pBStack_40,BrOnHasLocalEnvProperty,local_68._4_4_,uVar5,DVar10);
      local_68._0_4_ = Env;
      rec.kind = DVar10;
    }
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    EnsureArray((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)local_b0,0);
    *(DynamicLoadKind *)
     ((long)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
            _vptr_ReadOnlyList +
     (long)(int)recList.
                super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                buffer * 0xc + 8) = rec.kind;
    *(ulong *)((long)recList.
                     super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                     _vptr_ReadOnlyList +
              (long)(int)recList.
                         super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                         .buffer * 0xc) = CONCAT44(local_68._4_4_,local_68._0_4_);
    recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
    _0_4_ = (int)recList.
                 super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                 buffer + 1;
  }
  if ((sym == (Symbol *)0x0) || ((sym->field_0x42 & 8) != 0)) {
    if ((this->flags & 0x404) == 0) {
      if (local_34 == 0xffffffff) {
        local_34 = 0xfffffffd;
      }
      else {
        Js::ByteCodeWriter::Reg2(pBStack_40,Ld_A,local_34,0xfffffffd);
      }
      if (local_38 == 0xffffffff) goto LAB_00817bed;
      Js::ByteCodeWriter::Reg2(pBStack_40,Ld_A,local_38,funcInfo->undefinedConstantRegister);
    }
    else {
      if (local_34 == 0xffffffff) {
        local_34 = FuncInfo::AcquireTmpRegister(funcInfo);
      }
      if (sym == (Symbol *)0x0) {
        PVar4 = *(PropertyId *)(recList._40_8_ + 0x1c);
      }
      else {
        PVar4 = Symbol::EnsurePosition(sym,this);
      }
      if (local_38 == 0xffffffff) {
        local_38 = FuncInfo::AcquireTmpRegister(funcInfo);
      }
      uVar5 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,PVar4);
      Js::ByteCodeWriter::ScopedProperty2(pBStack_40,ScopedLdInst,local_34,uVar5,local_38);
    }
  }
  else if (local_34 == 0xffffffff) {
    local_34 = 0xffffffff;
  }
  else {
    if (local_44 == -1) {
      if (pSVar8->innerScopeIndex == 0xffffffff) {
        if (stack0xffffffffffffffa8 == funcInfo->paramScope) {
          if ((funcInfo->frameObjRegister == 0xffffffff) ||
             (OVar3 = LdParamObj, (funcInfo->field_0xb5 & 0x80) != 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x1117,
                               "(funcInfo->frameObjRegister != Js::Constants::NoRegister && !funcInfo->IsBodyAndParamScopeMerged())"
                               ,
                               "funcInfo->frameObjRegister != Js::Constants::NoRegister && !funcInfo->IsBodyAndParamScopeMerged()"
                              );
            if (!bVar2) goto LAB_00817fc2;
            OVar3 = LdParamObj;
LAB_00817bbc:
            *puVar7 = 0;
          }
        }
        else {
          if (stack0xffffffffffffffa8 != funcInfo->bodyScope) {
            Js::ByteCodeWriter::Reg2(pBStack_40,Ld_A,local_34,rec.label);
            goto LAB_00817bd1;
          }
          OVar3 = LdLocalObj;
          if (funcInfo->frameObjRegister == 0xffffffff) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x1120,"(funcInfo->frameObjRegister != Js::Constants::NoRegister)",
                               "funcInfo->frameObjRegister != Js::Constants::NoRegister");
            if (!bVar2) goto LAB_00817fc2;
            OVar3 = LdLocalObj;
            goto LAB_00817bbc;
          }
        }
        Js::ByteCodeWriter::Reg1(pBStack_40,OVar3,local_34);
      }
      else {
        Js::ByteCodeWriter::Reg1Unsigned1(pBStack_40,LdInnerScope,local_34,pSVar8->innerScopeIndex);
      }
    }
    else {
      if ((pSVar8->field_0x44 & 2) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x110d,"(scope->GetIsObject())","scope->GetIsObject()");
        if (!bVar2) goto LAB_00817fc2;
        *puVar7 = 0;
      }
      Js::ByteCodeWriter::SlotI1(pBStack_40,LdEnvObj,local_34,local_44 + 1);
    }
LAB_00817bd1:
    if (local_38 == 0xffffffff) {
LAB_00817bed:
      local_38 = funcInfo->undefinedConstantRegister;
    }
    else {
      Js::ByteCodeWriter::Reg2(pBStack_40,Ld_A,local_38,funcInfo->undefinedConstantRegister);
    }
  }
  if ((int)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
           buffer == 0) {
LAB_00817f4d:
    *pThisLocation = local_38;
    *pInstLocation = local_34;
    local_b0 = (undefined1  [8])&PTR_IsReadOnly_014f2c30;
    if (recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
        _vptr_ReadOnlyList != (_func_int **)0x0) {
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                 recList.
                 super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                 _16_8_,recList.
                        super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                        ._vptr_ReadOnlyList,
                 (long)(int)recList.
                            super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                            .alloc * 0xc);
    }
    return;
  }
  if (local_34 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1130,"(instLocation != Js::Constants::NoRegister)",
                       "instLocation != Js::Constants::NoRegister");
    if (!bVar2) goto LAB_00817fc2;
    *puVar7 = 0;
  }
  if (local_38 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1131,"(thisLocation != Js::Constants::NoRegister)",
                       "thisLocation != Js::Constants::NoRegister");
    if (!bVar2) {
LAB_00817fc2:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  labelID = Js::ByteCodeWriter::DefineLabel(pBStack_40);
  Js::ByteCodeWriter::Br(pBStack_40,labelID);
  unique0x00004780 = (Scope *)&funcInfo->undefinedConstantRegister;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  index = 0;
  do {
    pTVar9 = JsUtil::
             List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)local_b0,index);
    Js::ByteCodeWriter::MarkLabel(pBStack_40,pTVar9->label);
    pTVar9 = JsUtil::
             List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)local_b0,index);
    switch(pTVar9->kind) {
    case Local:
      Js::ByteCodeWriter::Reg1(pBStack_40,LdLocalObj_ReuseLoc,local_34);
      if (local_38 != *(RegSlot *)&stack0xffffffffffffffa8->enclosingScope) {
        if (local_38 == local_34) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x113f,"(thisLocation != instLocation)","thisLocation != instLocation"
                            );
LAB_00817eaf:
          if (bVar2 == false) goto LAB_00817fc2;
          *puVar7 = 0;
        }
LAB_00817ec1:
        OVar3 = Ld_A_ReuseLoc;
        pSVar8 = stack0xffffffffffffffa8;
        goto LAB_00817ec5;
      }
      break;
    case Env:
      pTVar9 = JsUtil::
               List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       *)local_b0,index);
      Js::ByteCodeWriter::SlotI1(pBStack_40,LdEnvObj_ReuseLoc,local_34,(pTVar9->field_2).index);
      if (local_38 != *(RegSlot *)&stack0xffffffffffffffa8->enclosingScope) {
        if (local_38 == local_34) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x1148,"(thisLocation != instLocation)","thisLocation != instLocation"
                            );
          goto LAB_00817eaf;
        }
        goto LAB_00817ec1;
      }
      break;
    case LocalWith:
      pTVar9 = JsUtil::
               List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       *)local_b0,index);
      Js::ByteCodeWriter::Reg2
                (pBStack_40,UnwrapWithObj_ReuseLoc,local_34,(pTVar9->field_2).instance);
      pTVar9 = JsUtil::
               List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       *)local_b0,index);
      OVar3 = UnwrapWithObj_ReuseLoc;
      pSVar8 = (Scope *)&pTVar9->field_2;
LAB_00817ec5:
      Js::ByteCodeWriter::Reg2(pBStack_40,OVar3,local_38,*(RegSlot *)&pSVar8->enclosingScope);
      break;
    case EnvWith:
      value = FuncInfo::AcquireTmpRegister(funcInfo);
      pTVar9 = JsUtil::
               List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       *)local_b0,index);
      Js::ByteCodeWriter::SlotI1(pBStack_40,LdEnvObj,value,(pTVar9->field_2).index);
      Js::ByteCodeWriter::Reg2(pBStack_40,UnwrapWithObj_ReuseLoc,local_34,value);
      Js::ByteCodeWriter::Reg2(pBStack_40,UnwrapWithObj_ReuseLoc,local_38,value);
      FuncInfo::ReleaseTmpRegister(funcInfo,value);
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x115d,"((0))","(0)");
      if (!bVar2) goto LAB_00817fc2;
      *puVar7 = 0;
    }
    if (index == (int)recList.
                      super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                      .buffer + -1) break;
    Js::ByteCodeWriter::Br(pBStack_40,labelID);
    index = index + 1;
  } while( true );
  Js::ByteCodeWriter::MarkLabel(pBStack_40,labelID);
  goto LAB_00817f4d;
}

Assistant:

void ByteCodeGenerator::EmitLoadInstance(Symbol *sym, IdentPtr pid, Js::RegSlot *pThisLocation, Js::RegSlot *pInstLocation, FuncInfo *funcInfo)
{
    Js::RegSlot scopeLocation = Js::Constants::NoRegister;
    Js::RegSlot thisLocation = *pThisLocation;
    Js::RegSlot instLocation = *pInstLocation;
    Js::PropertyId envIndex = -1;
    Scope *scope = nullptr;
    Scope *symScope = sym ? sym->GetScope() : this->globalScope;
    Assert(symScope);

    if (sym != nullptr && sym->GetIsModuleExportStorage())
    {
        *pInstLocation = Js::Constants::NoRegister;
        return;
    }

    JsUtil::List<DynamicLoadRecord, ArenaAllocator> recList(this->alloc);

    for (;;)
    {
        scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        if (scope == this->globalScope)
        {
            break;
        }

        if (scope != symScope)
        {
            // We're not sure where the function is (eval/with/etc).
            // So we're going to need registers to hold the instance where we (dynamically) find
            // the function, and possibly to hold the "this" pointer we will pass to it.
            // Assign them here so that they can't overlap with the scopeLocation assigned below.
            // Otherwise we wind up with temp lifetime confusion in the IRBuilder. (Win8 281689)
            if (instLocation == Js::Constants::NoRegister)
            {
                instLocation = funcInfo->AcquireTmpRegister();
            }
        }

        if (envIndex == -1)
        {
            Assert(funcInfo == scope->GetFunc());
            scopeLocation = scope->GetLocation();
        }

        if (scope == symScope)
        {
            break;
        }

        // Found a scope to which the property may have been added.
        Assert(scope && scope->GetIsDynamic());
        AssertOrFailFast(scope->GetIsObject());

        // Record dynamic scopes, in order. Define a label for each one. Remember whether we've seen a 'with'.
        // For each dynamic scope, emit BrOnHas[Env,Local]Property $Ln, where n is the scope's position in the list
        // Then emit code for default access (i.e., static binding). If no 'with', do not create a temp for 'this', just use 'undefined'.
        // End static portion with 'Br $Ldone'.
        // Then, for each item in list, emit:
        // $Ln:
        //     copy dynamic scope to 'instance' temp, using 'reuse_loc' form of the opcode
        //     do the same for 'this' temp', only if we've seen a 'with'
        //     if not the last item in the list, Br $Ldone

        DynamicLoadRecord rec;
            
        rec.label = this->m_writer.DefineLabel();
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

        if (scope->GetScopeType() != ScopeType_With)
        {
            if (envIndex == -1)
            {
                // The local body scope. Branch cannot bail on implicit calls.
              
                this->m_writer.BrLocalProperty(Js::OpCode::BrOnHasLocalProperty, rec.label, propertyIndex);
                rec.kind = DynamicLoadKind::Local;
            }
            else
            {
                // Function body scope in an enclosing function that calls eval.
                // Emit a branch opcode that does not require bail on implicit calls.

                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasLocalEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::Env;
                rec.index = frameDisplayIndex;
            }
        }
        else
        {
            if (thisLocation == Js::Constants::NoRegister)
            {
                thisLocation = funcInfo->AcquireTmpRegister();
            }

            if (envIndex == -1)
            {
                // With object declared in this function. HasProperty may have implicit calls.
                this->m_writer.BrProperty(Js::OpCode::BrOnHasProperty, rec.label, scopeLocation, propertyIndex);
                rec.kind = DynamicLoadKind::LocalWith;
                rec.instance = scopeLocation;
            }
            else
            {
                // With object declared in an enclosing function. HasProperty may have implicit calls.
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::EnvWith;
                rec.index = frameDisplayIndex;
            }
        }

        recList.Add(rec);
    }

    if (sym == nullptr || sym->GetIsGlobal())
    {
        if (this->flags & (fscrEval | fscrImplicitThis))
        {
            // Load of a symbol with unknown scope from within eval.
            // Get it from the closure environment.
            if (instLocation == Js::Constants::NoRegister)
            {
                instLocation = funcInfo->AcquireTmpRegister();
            }

            Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();

            if (thisLocation == Js::Constants::NoRegister)
            {
                thisLocation = funcInfo->AcquireTmpRegister();
            }
            this->m_writer.ScopedProperty2(Js::OpCode::ScopedLdInst, instLocation,
                funcInfo->FindOrAddReferencedPropertyId(propertyId), thisLocation);
        }
        else
        {
            if (instLocation == Js::Constants::NoRegister)
            {
                instLocation = ByteCodeGenerator::RootObjectRegister;
            }
            else
            {
                this->m_writer.Reg2(Js::OpCode::Ld_A, instLocation, ByteCodeGenerator::RootObjectRegister);
            }

            if (thisLocation == Js::Constants::NoRegister)
            {
                thisLocation = funcInfo->undefinedConstantRegister;
            }
            else
            {
                this->m_writer.Reg2(Js::OpCode::Ld_A, thisLocation, funcInfo->undefinedConstantRegister);
            }
        }
    }
    else if (instLocation != Js::Constants::NoRegister)
    {
        if (envIndex != -1)
        {
            AssertOrFailFast(scope->GetIsObject());
            this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation,
                envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var));
        }
        else if (scope->HasInnerScopeIndex())
        {
            this->m_writer.Reg1Unsigned1(Js::OpCode::LdInnerScope, instLocation, scope->GetInnerScopeIndex());
        }
        else if (symScope == funcInfo->GetParamScope())
        {
            Assert(funcInfo->frameObjRegister != Js::Constants::NoRegister && !funcInfo->IsBodyAndParamScopeMerged());
            this->m_writer.Reg1(Js::OpCode::LdParamObj, instLocation);
        }
        else if (symScope != funcInfo->GetBodyScope())
        {
            this->m_writer.Reg2(Js::OpCode::Ld_A, instLocation, scopeLocation);
        }
        else
        {
            Assert(funcInfo->frameObjRegister != Js::Constants::NoRegister);
            this->m_writer.Reg1(Js::OpCode::LdLocalObj, instLocation);
        }

        if (thisLocation != Js::Constants::NoRegister)
        {
            this->m_writer.Reg2(Js::OpCode::Ld_A, thisLocation, funcInfo->undefinedConstantRegister);
        }
        else
        {
            thisLocation = funcInfo->undefinedConstantRegister;
        }
    }

    if (!recList.Empty())
    {
        Assert(instLocation != Js::Constants::NoRegister);
        Assert(thisLocation != Js::Constants::NoRegister);

        Js::ByteCodeLabel doneLabel = this->m_writer.DefineLabel();
        this->m_writer.Br(doneLabel);

        for (int i = 0;; i++)
        {
            this->m_writer.MarkLabel(recList.Item(i).label);
            switch(recList.Item(i).kind)
            {
                case DynamicLoadKind::Local:
                    this->m_writer.Reg1(Js::OpCode::LdLocalObj_ReuseLoc, instLocation);
                    if (thisLocation != funcInfo->undefinedConstantRegister)
                    {
                        Assert(thisLocation != instLocation);
                        this->m_writer.Reg2(Js::OpCode::Ld_A_ReuseLoc, thisLocation, funcInfo->undefinedConstantRegister);
                    }
                    break;

                case DynamicLoadKind::Env:
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj_ReuseLoc, instLocation, recList.Item(i).index);
                    if (thisLocation != funcInfo->undefinedConstantRegister)
                    {
                        Assert(thisLocation != instLocation);
                        this->m_writer.Reg2(Js::OpCode::Ld_A_ReuseLoc, thisLocation, funcInfo->undefinedConstantRegister);
                    }
                    break;

                case DynamicLoadKind::LocalWith:
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj_ReuseLoc, instLocation, recList.Item(i).instance);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj_ReuseLoc, thisLocation, recList.Item(i).instance);
                    break;

                case DynamicLoadKind::EnvWith:
                {
                    Js::RegSlot tmpReg = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, tmpReg, recList.Item(i).index);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj_ReuseLoc, instLocation, tmpReg);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj_ReuseLoc, thisLocation, tmpReg);
                    funcInfo->ReleaseTmpRegister(tmpReg);
                    break;
                }

                default:
                    AssertOrFailFast(UNREACHED);
            }

            if (i == recList.Count() - 1)
            {
                break;
            }
            this->m_writer.Br(doneLabel);
        }

        this->m_writer.MarkLabel(doneLabel);
    }

    *pThisLocation = thisLocation;
    *pInstLocation = instLocation;
}